

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::RNEMD::SPFForceManager::~SPFForceManager(SPFForceManager *this)

{
  ~SPFForceManager(this);
  operator_delete(this,0xd68);
  return;
}

Assistant:

SPFForceManager::~SPFForceManager() {
    delete temporarySourceSnapshot_;
    delete temporarySinkSnapshot_;
  }